

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::Simple8b_RLE<true>::decodeArray
          (Simple8b_RLE<true> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint outCount;
  uint32_t uVar1;
  NotEnoughStorage *this_00;
  ulong req;
  
  outCount = *in;
  req = (ulong)outCount;
  if (req <= *nvalue) {
    *nvalue = req;
    uVar1 = Simple8b_Codec::Decompress((uint64_t *)(in + 1),0,out,0,outCount);
    *nvalue = req;
    return in + (ulong)uVar1 * 2 + 1;
  }
  this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
  NotEnoughStorage::NotEnoughStorage(this_00,req);
  __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) {
    (void)length;

    uint32_t markednvalue;
    if (MarkLength) {
      markednvalue = *in++;
      if (markednvalue > nvalue)
        throw NotEnoughStorage(markednvalue);
    }
    const size_t actualvalue = MarkLength ? markednvalue : nvalue;
    // this may lead to unaligned access. Performance may be affected.
    // not much of an effect in practice on recent Intel processors.
    const uint64_t *in64 = reinterpret_cast<const uint64_t *>(in);
#ifndef NDEBUG
    const uint32_t *const endin(in + length);
    const uint64_t *finalin64 = reinterpret_cast<const uint64_t *>(endin);
#endif
    if (nvalue < actualvalue) {
      fprintf(stderr, "possible overrun\n");
    }
    nvalue = actualvalue;

    uint32_t pos = 0;

    pos = Simple8b_Codec::Decompress(in64, 0, out, 0, uint32_t(nvalue));

    assert(in64 + pos <= finalin64);
    in = reinterpret_cast<const uint32_t *>(in64 + pos);
    assert(in <= endin);
    nvalue = MarkLength ? actualvalue : nvalue;
    return in;
  }